

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwhatsthis.cpp
# Opt level: O3

void __thiscall QWhatsThisPrivate::~QWhatsThisPrivate(QWhatsThisPrivate *this)

{
  QObject *pQVar1;
  Data *pDVar2;
  long in_FS_OFFSET;
  code *local_38;
  undefined8 local_30;
  QWhatsThisPrivate *pQStack_28;
  undefined8 local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined ***)this = &PTR_metaObject_007eceb0;
  pDVar2 = (this->action).wp.d;
  if ((pDVar2 != (Data *)0x0) &&
     (pQVar1 = (this->action).wp.value, pQVar1 != (QObject *)0x0 && *(int *)(pDVar2 + 4) != 0)) {
    QAction::setChecked(SUB81(pQVar1,0));
  }
  QGuiApplication::restoreOverrideCursor();
  local_38 = QFont::strikeOut;
  local_30 = 0xaaaaaaaa0000000d;
  local_20 = 0xaaaaaaaaffffffff;
  pQStack_28 = this;
  QAccessible::updateAccessibility((QAccessibleEvent *)&local_38);
  instance = (QWhatsThisPrivate *)0x0;
  QAccessibleEvent::~QAccessibleEvent((QAccessibleEvent *)&local_38);
  pDVar2 = (this->action).wp.d;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    *(int *)pDVar2 = *(int *)pDVar2 + -1;
    UNLOCK();
    if (*(int *)pDVar2 == 0) {
      pDVar2 = (this->action).wp.d;
      if (pDVar2 == (Data *)0x0) {
        pDVar2 = (Data *)0x0;
      }
      operator_delete(pDVar2);
    }
  }
  QObject::~QObject(&this->super_QObject);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QWhatsThisPrivate::~QWhatsThisPrivate()
{
#if QT_CONFIG(action)
    if (action)
        action->setChecked(false);
#endif // QT_CONFIG(action)
#ifndef QT_NO_CURSOR
    QGuiApplication::restoreOverrideCursor();
#endif
#if QT_CONFIG(accessibility)
    QAccessibleEvent event(this, QAccessible::ContextHelpEnd);
    QAccessible::updateAccessibility(&event);
#endif
    instance = nullptr;
}